

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void sensors_analytics::Sdk::TrackInstallation(string *event_name,PropertiesNode *properties)

{
  Sdk *this;
  Sdk *pSVar1;
  PropertiesNode properties_node;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  ObjectNode local_50;
  
  if (instance_ != (Sdk *)0x0) {
    local_50.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_50.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header;
    local_50.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_50.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    local_50.properties_map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_50._vptr_ObjectNode = (_func_int **)&PTR_SetList_00125d50;
    local_50.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_50.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string((string *)&local_90,"$ios_install_source",(allocator *)&local_70);
    utils::ObjectNode::SetString(&local_50,&local_90,"");
    std::__cxx11::string::~string((string *)&local_90);
    utils::ObjectNode::MergeFrom(&local_50,&properties->super_ObjectNode);
    this = instance_;
    std::__cxx11::string::string((string *)&local_90,"track",&local_91);
    pSVar1 = instance_;
    std::__cxx11::string::string((string *)&local_70,"",&local_92);
    AddEvent(this,&local_90,event_name,&local_50,&pSVar1->distinct_id_,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    utils::ObjectNode::~ObjectNode(&local_50);
  }
  return;
}

Assistant:

void Sdk::TrackInstallation(const string &event_name,
                            const PropertiesNode &properties) {
  if (instance_) {
    PropertiesNode properties_node;
    properties_node.SetString("$ios_install_source", "");
    properties_node.MergeFrom(properties);
    instance_->AddEvent("track",
                        event_name,
                        properties_node,
                        instance_->distinct_id_,
                        "");
  }
}